

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O0

void __thiscall Poll::Poll(Poll *this)

{
  int val;
  _union_1457 _Stack_a8;
  sigaction sa;
  Poll *this_local;
  
  sa.sa_restorer = (_func_void *)this;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector(&this->fds);
  std::
  unordered_map<int,_std::shared_ptr<Subscriber>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>_>
  ::unordered_map(&this->subs);
  std::
  map<unsigned_long,_std::shared_ptr<Alarm>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<Alarm>_>_>_>
  ::map(&this->alarms);
  this->shutdown = false;
  sa.sa_mask.__val[0xe] = 0;
  sa.sa_mask.__val[0xc] = 0;
  sa.sa_mask.__val[0xd] = 0;
  sa.sa_mask.__val[10] = 0;
  sa.sa_mask.__val[0xb] = 0;
  sa.sa_mask.__val[8] = 0;
  sa.sa_mask.__val[9] = 0;
  sa.sa_mask.__val[6] = 0;
  sa.sa_mask.__val[7] = 0;
  sa.sa_mask.__val[4] = 0;
  sa.sa_mask.__val[5] = 0;
  sa.sa_mask.__val[2] = 0;
  sa.sa_mask.__val[3] = 0;
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1] = 0;
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sa.sa_flags = 0;
  sa._140_4_ = 0;
  _Stack_a8 = (_union_1457)0x1;
  sa.sa_mask.__val[0xf] = 0;
  val = sigaction(0xd,(sigaction *)&_Stack_a8,(sigaction *)0x0);
  no_err(val,"Could not ignore sigpipe");
  return;
}

Assistant:

Poll::Poll() : shutdown(false) {
  struct sigaction sa;
  bzero(&sa, sizeof(sa));
  sa.sa_handler = SIG_IGN;
  sa.sa_flags = 0;
  no_err(sigaction(SIGPIPE, &sa, 0), "Could not ignore sigpipe");
}